

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

bool __thiscall Engine::propagate(Engine *this)

{
  int iVar1;
  vec<Propagator_*> *pvVar2;
  long *plVar3;
  bool bVar4;
  char cVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  if (this->async_fail == true) {
    this->async_fail = false;
  }
  else {
    this->last_prop = (Propagator *)0x0;
    do {
      if ((sat.qhead.data[sat.qhead.sz - 1] != sat.trail.data[sat.trail.sz - 1].sz) &&
         (bVar4 = SAT::propagate(&sat), !bVar4)) {
        return false;
      }
      if ((this->v_queue).sz != 0) {
        uVar8 = 0;
        do {
          IntVar::wakePropagators((this->v_queue).data[uVar8]);
          uVar8 = uVar8 + 1;
        } while (uVar8 < (this->v_queue).sz);
      }
      if ((this->v_queue).data != (IntVar **)0x0) {
        (this->v_queue).sz = 0;
      }
      if (sat.confl != (Clause *)0x0) {
        return false;
      }
      this->last_prop = (Propagator *)0x0;
      pvVar2 = (this->p_queue).data;
      lVar6 = 0;
      while (iVar1 = *(int *)((long)&pvVar2->sz + lVar6), iVar1 == 0) {
        lVar6 = lVar6 + 0x10;
        if (lVar6 == 0x60) {
          return true;
        }
      }
      uVar7 = iVar1 - 1;
      plVar3 = *(long **)(*(long *)((long)&pvVar2->data + lVar6) + (ulong)uVar7 * 8);
      *(uint *)((long)&pvVar2->sz + lVar6) = uVar7;
      this->propagations = this->propagations + 1;
      cVar5 = (**(code **)(*plVar3 + 0x18))(plVar3);
      (**(code **)(*plVar3 + 0x20))(plVar3);
    } while (cVar5 != '\0');
  }
  return false;
}

Assistant:

bool Engine::propagate() {
	if (async_fail) {
		async_fail = false;
		assert(!so.lazy || sat.confl);
		return false;
	}

	last_prop = nullptr;

WakeUp:

	if (!sat.consistent() && !sat.propagate()) {
		return false;
	}

	for (unsigned int i = 0; i < v_queue.size(); i++) {
		v_queue[i]->wakePropagators();
	}
	v_queue.clear();

	if (sat.confl != nullptr) {
		return false;
	}

	last_prop = nullptr;

	for (int i = 0; i < num_queues; i++) {
		if (p_queue[i].size() != 0) {
			Propagator* p = p_queue[i].last();
			p_queue[i].pop();
			propagations++;
			const bool ok = p->propagate();
			p->clearPropState();
			if (!ok) {
				return false;
			}
			goto WakeUp;
		}
	}

	return true;
}